

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

env * __thiscall lest::env::sections_abi_cxx11_(env *this)

{
  bool bVar1;
  reference pbVar2;
  long in_RSI;
  string local_d8 [32];
  string local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> section;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  iterator __end2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  text msg;
  allocator local_39;
  string local_38 [40];
  env *this_local;
  
  this_local = this;
  if ((*(byte *)(in_RSI + 0x12) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"",&local_39);
    std::__cxx11::string::string((string *)this,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    std::__cxx11::string::string((string *)&__range2);
    __begin2._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x40);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__begin2._M_current);
    local_80._M_current = __end2._M_current;
    local_90._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(__begin2._M_current);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_80,&local_90);
      if (!bVar1) break;
      pbVar2 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_80);
      std::__cxx11::string::string(local_b8,(string *)pbVar2);
      std::operator+((char *)local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\n  ");
      std::__cxx11::string::operator+=((string *)&__range2,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_b8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_80);
    }
    std::__cxx11::string::string((string *)this,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
  }
  return this;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( auto section : ctx )
        {
            msg += "\n  " + section;
        }
        return msg;
    }